

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffiimgll(fitsfile *fptr,int bitpix,int naxis,LONGLONG *naxes,int *status)

{
  int iVar1;
  char *name;
  char *pcVar2;
  long *in_RCX;
  uint in_EDX;
  uint in_ESI;
  int *in_RDI;
  int *in_R8;
  char naxiskey [75];
  char card [81];
  int in_stack_000000c8;
  char errmsg [81];
  LONGLONG datasize;
  LONGLONG newstart;
  LONGLONG npixels;
  long nblocks;
  int onaxis;
  int ii;
  int maxhdu;
  int nexthdu;
  int bytlen;
  int *in_stack_000009e0;
  fitsfile *in_stack_000009e8;
  int *in_stack_000015a0;
  int in_stack_000015ac;
  long in_stack_000015b0;
  fitsfile *in_stack_000015b8;
  int *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  fitsfile *in_stack_fffffffffffffe88;
  int *in_stack_fffffffffffffe90;
  LONGLONG *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  fitsfile *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb4;
  char *in_stack_fffffffffffffeb8;
  int *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  fitsfile *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  LONGLONG in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  fitsfile *in_stack_ffffffffffffff38;
  char local_b8 [56];
  int *in_stack_ffffffffffffff80;
  fitsfile *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  fitsfile *in_stack_ffffffffffffffa8;
  undefined8 uVar3;
  long local_50;
  int local_3c;
  int local_38;
  int local_30;
  int local_2c;
  int local_4;
  
  if (*in_R8 < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
    }
    if ((*in_R8 == -9) ||
       ((*(long *)(*(long *)(in_RDI + 2) + 0x70) !=
         *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                  (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8) &&
        ((*(int *)(*(long *)(in_RDI + 2) + 0x54) != *(int *)(*(long *)(in_RDI + 2) + 0x60) ||
         (*(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                   (long)(*(int *)(*(long *)(in_RDI + 2) + 0x60) + 1) * 8) <
          *(long *)(*(long *)(in_RDI + 2) + 0x30))))))) {
      if (in_ESI == 8) {
        local_2c = 1;
      }
      else if (in_ESI == 0x10) {
        local_2c = 2;
      }
      else if ((in_ESI == 0x20) || (in_ESI == 0xffffffe0)) {
        local_2c = 4;
      }
      else {
        if ((in_ESI != 0x40) && (in_ESI != 0xffffffc0)) {
          snprintf(local_b8,0x51,"Illegal value for BITPIX keyword: %d",(ulong)in_ESI);
          ffpmsg((char *)0x147d31);
          *in_R8 = 0xd3;
          return 0xd3;
        }
        local_2c = 8;
      }
      if (((int)in_EDX < 0) || (999 < (int)in_EDX)) {
        snprintf(local_b8,0x51,"Illegal value for NAXIS keyword: %d",(ulong)in_EDX);
        ffpmsg((char *)0x147d9b);
        *in_R8 = 0xd4;
        local_4 = 0xd4;
      }
      else {
        for (local_38 = 0; local_38 < (int)in_EDX; local_38 = local_38 + 1) {
          if (in_RCX[local_38] < 0) {
            snprintf(local_b8,0x51,"Illegal value for NAXIS%d keyword: %ld",(ulong)(local_38 + 1),
                     in_RCX[local_38]);
            ffpmsg((char *)0x147e35);
            *in_R8 = 0xd5;
            return 0xd5;
          }
        }
        if (in_EDX == 0) {
          local_50 = 0;
        }
        else {
          local_50 = *in_RCX;
        }
        for (local_38 = 1; local_38 < (int)in_EDX; local_38 = local_38 + 1) {
          local_50 = local_50 * in_RCX[local_38];
        }
        name = (char *)(local_50 * local_2c);
        pcVar2 = name + 0xb3f;
        if (*(int *)(*(long *)(in_RDI + 2) + 0x5c) == 1) {
          ffrdef(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          ffpdfl(in_stack_000009e8,in_stack_000009e0);
          if (*in_R8 == -9) {
            *in_R8 = 0;
            ffmahd(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,
                   in_stack_fffffffffffffee0);
            ffgidm(in_stack_fffffffffffffe88,
                   (int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78);
            if (local_3c < 1) {
              strcpy(&stack0xfffffffffffffe98,"NAXIS");
            }
            else {
              ffkeyn(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                     (char *)in_stack_fffffffffffffea8,
                     (int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
            }
            ffgcrd(in_stack_ffffffffffffffa8,name,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90);
            ffikyj(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            ffikyj(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            if (0 < *in_R8) {
              return *in_R8;
            }
            iVar1 = ffdkey((fitsfile *)naxiskey._24_8_,(char *)naxiskey._16_8_,(int *)naxiskey._8_8_
                          );
            if (iVar1 != 0) {
              *in_R8 = 0;
            }
            ffrdef(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
            iVar1 = ffiblk(in_stack_000015b8,in_stack_000015b0,in_stack_000015ac,in_stack_000015a0);
            if (0 < iVar1) {
              return *in_R8;
            }
            local_30 = 0;
            uVar3 = 0;
          }
          else {
            local_30 = *(int *)(*(long *)(in_RDI + 2) + 0x54) + 1;
            uVar3 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)local_30 * 8);
            *(undefined4 *)(*(long *)(in_RDI + 2) + 0x58) = 0;
            iVar1 = ffiblk(in_stack_000015b8,in_stack_000015b0,in_stack_000015ac,in_stack_000015a0);
            if (0 < iVar1) {
              return *in_R8;
            }
          }
          *(int *)(*(long *)(in_RDI + 2) + 0x60) = *(int *)(*(long *)(in_RDI + 2) + 0x60) + 1;
          for (local_38 = *(int *)(*(long *)(in_RDI + 2) + 0x60);
              *(int *)(*(long *)(in_RDI + 2) + 0x54) < local_38; local_38 = local_38 + -1) {
            *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)(local_38 + 1) * 8) =
                 *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)local_38 * 8);
          }
          if (local_30 == 0) {
            *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + 8) =
                 ((long)pcVar2 / 0xb40 + 1) * 0xb40;
          }
          *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)local_30 * 8) = uVar3;
          *(int *)(*(long *)(in_RDI + 2) + 0x54) = local_30;
          *in_RDI = local_30;
          *(undefined8 *)(*(long *)(in_RDI + 2) + 0x80) =
               *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)local_30 * 8);
          *(undefined8 *)(*(long *)(in_RDI + 2) + 0x70) =
               *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)local_30 * 8);
          *(long *)(*(long *)(in_RDI + 2) + 0x88) =
               *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)local_30 * 8) + 0xb40;
          *(undefined4 *)(*(long *)(in_RDI + 2) + 0x58) = 0;
          ffphprll((fitsfile *)card._56_8_,card._52_4_,card._48_4_,card._44_4_,
                   (LONGLONG *)card._32_8_,card._24_8_,stack0x000000c0,in_stack_000000c8,
                   (int *)errmsg._0_8_);
          ffrdef(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          local_4 = *in_R8;
        }
        else {
          *in_R8 = 0x70;
          local_4 = 0x70;
        }
      }
    }
    else {
      ffcrimll(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      local_4 = *in_R8;
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffiimgll(fitsfile *fptr,    /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           LONGLONG *naxes,     /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
  insert an IMAGE extension following the current HDU 
*/
{
    int bytlen, nexthdu, maxhdu, ii, onaxis;
    long nblocks;
    LONGLONG npixels, newstart, datasize;
    char errmsg[FLEN_ERRMSG], card[FLEN_CARD], naxiskey[FLEN_KEYWORD];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    maxhdu = (fptr->Fptr)->maxhdu;

    if (*status != PREPEND_PRIMARY)
    {
      /* if the current header is completely empty ...  */
      if (( (fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])
        /* or, if we are at the end of the file, ... */
      ||  ( (((fptr->Fptr)->curhdu) == maxhdu ) &&
       ((fptr->Fptr)->headstart[maxhdu + 1] >= (fptr->Fptr)->logfilesize ) ) )
      {
        /* then simply append new image extension */
        ffcrimll(fptr, bitpix, naxis, naxes, status);
        return(*status);
      }
    }

    if (bitpix == 8)
        bytlen = 1;
    else if (bitpix == 16)
        bytlen = 2;
    else if (bitpix == 32 || bitpix == -32)
        bytlen = 4;
    else if (bitpix == 64 || bitpix == -64)
        bytlen = 8;
    else
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for BITPIX keyword: %d", bitpix);
        ffpmsg(errmsg);
        return(*status = BAD_BITPIX);  /* illegal bitpix value */
    }
    if (naxis < 0 || naxis > 999)
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for NAXIS keyword: %d", naxis);
        ffpmsg(errmsg);
        return(*status = BAD_NAXIS);
    }

    for (ii = 0; ii < naxis; ii++)
    {
        if (naxes[ii] < 0)
        {
            snprintf(errmsg, FLEN_ERRMSG,
            "Illegal value for NAXIS%d keyword: %ld", ii + 1,  (long) naxes[ii]);
            ffpmsg(errmsg);
            return(*status = BAD_NAXES);
        }
    }

    /* calculate number of pixels in the image */
    if (naxis == 0)
        npixels = 0;
    else 
        npixels = naxes[0];

    for (ii = 1; ii < naxis; ii++)
        npixels = npixels * naxes[ii];

    datasize = npixels * bytlen;          /* size of image in bytes */
    nblocks = (long) (((datasize + 2879) / 2880) + 1);  /* +1 for the header */

    if ((fptr->Fptr)->writemode == READWRITE) /* must have write access */
    {   /* close the CHDU */
        ffrdef(fptr, status);  /* scan header to redefine structure */
        ffpdfl(fptr, status);  /* insure correct data file values */
    }
    else
        return(*status = READONLY_FILE);

    if (*status == PREPEND_PRIMARY)
    {
        /* inserting a new primary array; the current primary */
        /* array must be transformed into an image extension. */

        *status = 0;   
        ffmahd(fptr, 1, NULL, status);  /* move to the primary array */

        ffgidm(fptr, &onaxis, status);
        if (onaxis > 0)
            ffkeyn("NAXIS",onaxis, naxiskey, status);
        else
            strcpy(naxiskey, "NAXIS");

        ffgcrd(fptr, naxiskey, card, status);  /* read last NAXIS keyword */
        
        ffikyj(fptr, "PCOUNT", 0, "required keyword", status); /* add PCOUNT and */
        ffikyj(fptr, "GCOUNT", 1, "required keyword", status); /* GCOUNT keywords */

        if (*status > 0)
            return(*status);

        if (ffdkey(fptr, "EXTEND", status) ) /* delete the EXTEND keyword */
            *status = 0;

        /* redefine internal structure for this HDU */
        ffrdef(fptr, status);


        /* insert space for the primary array */
        if (ffiblk(fptr, nblocks, -1, status) > 0)  /* insert the blocks */
            return(*status);

        nexthdu = 0;  /* number of the new hdu */
        newstart = 0; /* starting addr of HDU */
    }
    else
    {
        nexthdu = ((fptr->Fptr)->curhdu) + 1; /* number of the next (new) hdu */
        newstart = (fptr->Fptr)->headstart[nexthdu]; /* save starting addr of HDU */

        (fptr->Fptr)->hdutype = IMAGE_HDU;  /* so that correct fill value is used */
        /* ffiblk also increments headstart for all following HDUs */
        if (ffiblk(fptr, nblocks, 1, status) > 0)  /* insert the blocks */
            return(*status);
    }

    ((fptr->Fptr)->maxhdu)++;      /* increment known number of HDUs in the file */
    for (ii = (fptr->Fptr)->maxhdu; ii > (fptr->Fptr)->curhdu; ii--)
        (fptr->Fptr)->headstart[ii + 1] = (fptr->Fptr)->headstart[ii]; /* incre start addr */

    if (nexthdu == 0)
       (fptr->Fptr)->headstart[1] = nblocks * 2880; /* start of the old Primary array */

    (fptr->Fptr)->headstart[nexthdu] = newstart; /* set starting addr of HDU */

    /* set default parameters for this new empty HDU */
    (fptr->Fptr)->curhdu = nexthdu;   /* we are now located at the next HDU */
    fptr->HDUposition = nexthdu;      /* we are now located at the next HDU */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[nexthdu];  
    (fptr->Fptr)->headend = (fptr->Fptr)->headstart[nexthdu];
    (fptr->Fptr)->datastart = ((fptr->Fptr)->headstart[nexthdu]) + 2880;
    (fptr->Fptr)->hdutype = IMAGE_HDU;  /* might need to be reset... */

    /* write the required header keywords */
    ffphprll(fptr, TRUE, bitpix, naxis, naxes, 0, 1, TRUE, status);

    /* redefine internal structure for this HDU */
    ffrdef(fptr, status);
    return(*status);
}